

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

uint32_t __thiscall
diligent_spirv_cross::Compiler::CombinedImageSamplerHandler::remap_parameter
          (CombinedImageSamplerHandler *this,uint32_t id)

{
  bool bVar1;
  SPIRVariable *pSVar2;
  pointer ppVar3;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_40;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_38;
  iterator itr;
  value_type *remapping;
  SPIRVariable *var;
  CombinedImageSamplerHandler *pCStack_18;
  uint32_t id_local;
  CombinedImageSamplerHandler *this_local;
  
  var._4_4_ = id;
  pCStack_18 = this;
  pSVar2 = maybe_get_backing_variable(this->compiler,id);
  if (pSVar2 != (SPIRVariable *)0x0) {
    var._4_4_ = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar2->super_IVariant).self);
  }
  bVar1 = ::std::
          stack<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_std::deque<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_std::allocator<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>_>_>
          ::empty(&this->parameter_remapping);
  if (bVar1) {
    this_local._4_4_ = var._4_4_;
  }
  else {
    itr.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur =
         (_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>)
         ::std::
         stack<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_std::deque<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_std::allocator<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>_>_>
         ::top(&this->parameter_remapping);
    local_38._M_cur =
         (__node_type *)
         ::std::
         unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
         ::find((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 *)itr.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                   ._M_cur,(key_type *)((long)&var + 4));
    local_40._M_cur =
         (__node_type *)
         ::std::
         end<std::unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>>
                   (itr.
                    super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                    _M_cur);
    bVar1 = ::std::__detail::operator!=(&local_38,&local_40);
    if (bVar1) {
      ppVar3 = ::std::__detail::
               _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::operator->
                         ((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                           *)&local_38);
      this_local._4_4_ = ppVar3->second;
    }
    else {
      this_local._4_4_ = var._4_4_;
    }
  }
  return this_local._4_4_;
}

Assistant:

uint32_t Compiler::CombinedImageSamplerHandler::remap_parameter(uint32_t id)
{
	auto *var = compiler.maybe_get_backing_variable(id);
	if (var)
		id = var->self;

	if (parameter_remapping.empty())
		return id;

	auto &remapping = parameter_remapping.top();
	auto itr = remapping.find(id);
	if (itr != end(remapping))
		return itr->second;
	else
		return id;
}